

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  long in_RCX;
  int in_EDX;
  sqlite3_file *in_RSI;
  long in_RDI;
  FileChunk *pNew;
  int iSpace;
  int iChunkOffset;
  FileChunk *pChunk;
  int rc;
  u8 *zWrite;
  int nWrite;
  MemJournal *p;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int n;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  sqlite3_file *in_stack_ffffffffffffffb0;
  undefined8 *puVar4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  sqlite3_file *__src;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if ((*(int *)(in_RDI + 0xc) < 1) || (in_EDX + in_RCX <= (long)*(int *)(in_RDI + 0xc))) {
    __src = in_RSI;
    iVar2 = in_EDX;
    if ((0 < in_RCX) && (in_RCX != *(long *)(in_RDI + 0x18))) {
      memjrnlTruncate(in_RSI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    if ((in_RCX == 0) && (*(long *)(in_RDI + 0x10) != 0)) {
      memcpy((void *)(*(long *)(in_RDI + 0x10) + 8),in_RSI,(long)in_EDX);
    }
    else {
      for (; 0 < iVar2; iVar2 = iVar2 - n) {
        puVar4 = *(undefined8 **)(in_RDI + 0x20);
        iVar1 = (int)(*(long *)(in_RDI + 0x18) % (long)*(int *)(in_RDI + 8));
        n = iVar2;
        if (*(int *)(in_RDI + 8) - iVar1 <= iVar2) {
          n = *(int *)(in_RDI + 8) - iVar1;
        }
        puVar3 = puVar4;
        if (iVar1 == 0) {
          puVar3 = (undefined8 *)sqlite3_malloc(n);
          if (puVar3 == (undefined8 *)0x0) {
            return 0xc0a;
          }
          *puVar3 = 0;
          if (puVar4 == (undefined8 *)0x0) {
            *(undefined8 **)(in_RDI + 0x10) = puVar3;
          }
          else {
            *puVar4 = puVar3;
          }
          *(undefined8 **)(in_RDI + 0x20) = puVar3;
        }
        memcpy((void *)((long)puVar3 + (long)iVar1 + 8),__src,(long)n);
        __src = (sqlite3_file *)((long)&__src->pMethods + (long)n);
        *(long *)(in_RDI + 0x18) = (long)n + *(long *)(in_RDI + 0x18);
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = memjrnlCreateFile((MemJournal *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8));
    if (local_4 == 0) {
      local_4 = sqlite3OsWrite(in_stack_ffffffffffffffb0,
                               (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                               ,iVar2,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
      ;
    }
  }
  return local_4;
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}